

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

size_type __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Hash,phmap::EqualTo<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>>>
::
erase<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>
          (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Hash,phmap::EqualTo<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>>>
           *this,key_arg<Int> *key)

{
  raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
  *this_00;
  char *pcVar1;
  size_type sVar2;
  uint uVar3;
  int iVar4;
  ushort uVar5;
  ushort uVar6;
  char cVar7;
  size_type extraout_RAX;
  ctrl_t h;
  long lVar8;
  uint uVar9;
  ulong i;
  long lVar10;
  size_t hashval;
  ulong uVar11;
  bool bVar12;
  __m128i match_1;
  undefined1 auVar13 [16];
  __m128i match;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  probe_seq<16UL> local_48;
  char cVar17;
  char cVar19;
  char cVar20;
  char cVar21;
  
  uVar11 = key->value;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar11;
  hashval = SUB168(auVar13 * ZEXT816(0xde5fb9d2630458e9),8) +
            SUB168(auVar13 * ZEXT816(0xde5fb9d2630458e9),0);
  lVar8 = (ulong)(((uint)(hashval >> 0x18) & 0xff ^
                  (uint)(hashval >> 8) & 0xffffff ^ (uint)(hashval >> 0x10) & 0xffff) & 0xf) * 0x30;
  this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
             *)(this + lVar8);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
  ::probe(&local_48,this_00,hashval);
  sVar2 = *(size_type *)(this + lVar8);
  auVar13 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar13 = pshuflw(auVar13,auVar13,0);
  do {
    pcVar1 = (char *)(sVar2 + local_48.offset_);
    cVar7 = pcVar1[0xf];
    cVar17 = auVar13[0];
    auVar18[0] = -(cVar17 == *pcVar1);
    cVar19 = auVar13[1];
    auVar18[1] = -(cVar19 == pcVar1[1]);
    cVar20 = auVar13[2];
    auVar18[2] = -(cVar20 == pcVar1[2]);
    cVar21 = auVar13[3];
    auVar18[3] = -(cVar21 == pcVar1[3]);
    auVar18[4] = -(cVar17 == pcVar1[4]);
    auVar18[5] = -(cVar19 == pcVar1[5]);
    auVar18[6] = -(cVar20 == pcVar1[6]);
    auVar18[7] = -(cVar21 == pcVar1[7]);
    auVar18[8] = -(cVar17 == pcVar1[8]);
    auVar18[9] = -(cVar19 == pcVar1[9]);
    auVar18[10] = -(cVar20 == pcVar1[10]);
    auVar18[0xb] = -(cVar21 == pcVar1[0xb]);
    auVar18[0xc] = -(cVar17 == pcVar1[0xc]);
    auVar18[0xd] = -(cVar19 == pcVar1[0xd]);
    auVar18[0xe] = -(cVar20 == pcVar1[0xe]);
    auVar18[0xf] = -(cVar21 == cVar7);
    for (uVar9 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                               (ushort)(auVar18[0xf] >> 7) << 0xf); uVar9 != 0;
        uVar9 = uVar9 - 1 & uVar9) {
      uVar3 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      i = uVar3 + local_48.offset_ & local_48.mask_;
      if (*(ulong *)(*(long *)(this + lVar8 + 8) + i * 0x10) == uVar11) {
        if (i == this_00->capacity_) {
          return sVar2;
        }
        if (-1 < *(char *)(sVar2 + i)) {
          this_00->size_ = this_00->size_ - 1;
          pcVar1 = (char *)(sVar2 + (i - 0x10 & this_00->capacity_));
          auVar14[0] = -(*pcVar1 == -0x80);
          auVar14[1] = -(pcVar1[1] == -0x80);
          auVar14[2] = -(pcVar1[2] == -0x80);
          auVar14[3] = -(pcVar1[3] == -0x80);
          auVar14[4] = -(pcVar1[4] == -0x80);
          auVar14[5] = -(pcVar1[5] == -0x80);
          auVar14[6] = -(pcVar1[6] == -0x80);
          auVar14[7] = -(pcVar1[7] == -0x80);
          auVar14[8] = -(pcVar1[8] == -0x80);
          auVar14[9] = -(pcVar1[9] == -0x80);
          auVar14[10] = -(pcVar1[10] == -0x80);
          auVar14[0xb] = -(pcVar1[0xb] == -0x80);
          auVar14[0xc] = -(pcVar1[0xc] == -0x80);
          auVar14[0xd] = -(pcVar1[0xd] == -0x80);
          auVar14[0xe] = -(pcVar1[0xe] == -0x80);
          auVar14[0xf] = -(pcVar1[0xf] == -0x80);
          uVar5 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar14[0xf] >> 7) << 0xf;
          uVar11 = 0;
          h = -2;
          if (uVar5 != 0) {
            pcVar1 = (char *)(sVar2 + i);
            auVar15[0] = -(*pcVar1 == -0x80);
            auVar15[1] = -(pcVar1[1] == -0x80);
            auVar15[2] = -(pcVar1[2] == -0x80);
            auVar15[3] = -(pcVar1[3] == -0x80);
            auVar15[4] = -(pcVar1[4] == -0x80);
            auVar15[5] = -(pcVar1[5] == -0x80);
            auVar15[6] = -(pcVar1[6] == -0x80);
            auVar15[7] = -(pcVar1[7] == -0x80);
            auVar15[8] = -(pcVar1[8] == -0x80);
            auVar15[9] = -(pcVar1[9] == -0x80);
            auVar15[10] = -(pcVar1[10] == -0x80);
            auVar15[0xb] = -(pcVar1[0xb] == -0x80);
            auVar15[0xc] = -(pcVar1[0xc] == -0x80);
            auVar15[0xd] = -(pcVar1[0xd] == -0x80);
            auVar15[0xe] = -(pcVar1[0xe] == -0x80);
            auVar15[0xf] = -(pcVar1[0xf] == -0x80);
            uVar6 = (ushort)(SUB161(auVar15 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar15[0xf] >> 7) << 0xf;
            if (uVar6 != 0) {
              iVar4 = 0;
              if (uVar6 != 0) {
                for (; (uVar6 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
                }
              }
              uVar9 = 0x1f;
              if (uVar5 != 0) {
                for (; ((uint)uVar5 << 0x10) >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              bVar12 = (uVar9 ^ 0x1f) + iVar4 < 0x10;
              uVar11 = (ulong)bVar12;
              h = -2;
              if (bVar12) {
                h = -0x80;
              }
            }
          }
          raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
          ::set_ctrl(this_00,i,h);
          (this_00->settings_).
          super__Tuple_impl<0UL,_unsigned_long,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
          .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
               (this_00->settings_).
               super__Tuple_impl<0UL,_unsigned_long,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
               .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + uVar11;
          return extraout_RAX;
        }
        __assert_fail("IsFull(*it.inner_.ctrl_) && \"erasing a dangling iterator\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                      ,0x7c8,
                      "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<Int, Int>, Hash, phmap::EqualTo<Int>, std::allocator<std::pair<const Int, Int>>>::erase_meta_only(const_iterator) [Policy = phmap::priv::FlatHashMapPolicy<Int, Int>, Hash = Hash, Eq = phmap::EqualTo<Int>, Alloc = std::allocator<std::pair<const Int, Int>>]"
                     );
      }
    }
    auVar16[0] = -(*pcVar1 == -0x80);
    auVar16[1] = -(pcVar1[1] == -0x80);
    auVar16[2] = -(pcVar1[2] == -0x80);
    auVar16[3] = -(pcVar1[3] == -0x80);
    auVar16[4] = -(pcVar1[4] == -0x80);
    auVar16[5] = -(pcVar1[5] == -0x80);
    auVar16[6] = -(pcVar1[6] == -0x80);
    auVar16[7] = -(pcVar1[7] == -0x80);
    auVar16[8] = -(pcVar1[8] == -0x80);
    auVar16[9] = -(pcVar1[9] == -0x80);
    auVar16[10] = -(pcVar1[10] == -0x80);
    auVar16[0xb] = -(pcVar1[0xb] == -0x80);
    auVar16[0xc] = -(pcVar1[0xc] == -0x80);
    auVar16[0xd] = -(pcVar1[0xd] == -0x80);
    auVar16[0xe] = -(pcVar1[0xe] == -0x80);
    auVar16[0xf] = -(cVar7 == -0x80);
    if ((((((((((((((((auVar16 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar16 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar16 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar16 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar16 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar16 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar16 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar16 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar16 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar16 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar16 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar16 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar16 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar16 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar7 == -0x80) {
      return sVar2;
    }
    lVar10 = local_48.offset_ + local_48.index_;
    local_48.index_ = local_48.index_ + 0x10;
    local_48.offset_ = lVar10 + 0x10U & local_48.mask_;
  } while( true );
}

Assistant:

size_type erase(const key_arg<K>& key) {
        auto always_erase =  [](const value_type&){ return true; };
        return erase_if_impl<K, decltype(always_erase), ReadWriteLock>(key, std::move(always_erase));
    }